

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  hdr_histogram *phVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  long b;
  bool bVar10;
  double b_00;
  double in_XMM1_Qa;
  hdr_histogram *expected_corrected_histogram;
  hdr_histogram *expected_histogram;
  hdr_histogram *h;
  long local_d0;
  anon_union_32_4_e99641da_for_specifics local_90;
  double local_68;
  hdr_histogram *h_1;
  
  h = (hdr_histogram *)0x0;
  iVar2 = hdr_init(1,3600000000,3,&h);
  pcVar7 = "Failed to allocate hdr_histogram";
  if ((iVar2 == 0) && (h != (hdr_histogram *)0x0)) {
    _Var1 = compare_int64((long)h->counts_len,0x5c00);
    if (!_Var1) {
      pcVar7 = "Incorrect array length";
      goto LAB_001012a1;
    }
    free(h);
    tests_run = tests_run + 1;
    h = (hdr_histogram *)0x0;
    iVar2 = 2;
    iVar3 = hdr_init(0,0x10000,2,&h);
    if (iVar3 == 0x16) {
      iVar3 = hdr_init(0x50,0x6e,5,&h);
      pcVar7 = (char *)0x0;
      if (iVar3 != 0x16) {
        pcVar7 = "Should have lowest < 2 * highest";
      }
    }
    else {
      pcVar7 = "Should not allow 0 as lowest trackable value";
    }
    tests_run = tests_run + 1;
    if (pcVar7 == (char *)0x0) {
      h = (hdr_histogram *)0x0;
      iVar3 = hdr_init(20000000,100000000,5,&h);
      if (iVar3 == 0) {
        hdr_record_value_atomic(h,100000000);
        hdr_record_value_atomic(h,20000000);
        hdr_record_value_atomic(h,30000000);
        phVar6 = h;
        iVar4 = hdr_value_at_percentile(h,50.0);
        _Var1 = hdr_values_are_equivalent(phVar6,20000000,iVar4);
        phVar6 = h;
        if (_Var1) {
          iVar4 = hdr_value_at_percentile(h,83.33);
          _Var1 = hdr_values_are_equivalent(phVar6,30000000,iVar4);
          phVar6 = h;
          if (_Var1) {
            iVar4 = hdr_value_at_percentile(h,83.34);
            _Var1 = hdr_values_are_equivalent(phVar6,100000000,iVar4);
            phVar6 = h;
            if (_Var1) {
              iVar4 = hdr_value_at_percentile(h,99.0);
              _Var1 = hdr_values_are_equivalent(phVar6,100000000,iVar4);
              pcVar7 = (char *)0x0;
              if (!_Var1) {
                pcVar7 = "99.0% Percentile";
              }
            }
            else {
              pcVar7 = "83.34% Percentile";
            }
          }
          else {
            pcVar7 = "83.33% Percentile";
          }
        }
        else {
          pcVar7 = "50.0% Percentile";
        }
      }
      else {
        pcVar7 = "Didn\'t create";
      }
      tests_run = tests_run + 1;
      if (pcVar7 == (char *)0x0) {
        h = (hdr_histogram *)0x0;
        iVar3 = hdr_alloc(36000000,-1,&h);
        pcVar7 = "Result was not EINVAL";
        if (iVar3 == 0x16) {
          if (h == (hdr_histogram *)0x0) {
            iVar3 = hdr_alloc(36000000,6,&h);
            if ((iVar3 == 0x16) && (pcVar7 = "Histogram was not null", h == (hdr_histogram *)0x0)) {
              pcVar7 = (char *)0x0;
            }
          }
          else {
            pcVar7 = "Histogram was not null";
          }
        }
        tests_run = tests_run + 1;
        if (pcVar7 == (char *)0x0) {
          load_histograms();
          if (raw_histogram->total_count == 0x2711) {
            pcVar7 = (char *)0x0;
            if (cor_histogram->total_count != 20000) {
              pcVar7 = "Total corrected count != 20000";
            }
          }
          else {
            pcVar7 = "Total raw count != 10001";
          }
          tests_run = tests_run + 1;
          if (pcVar7 == (char *)0x0) {
            load_histograms();
            iVar4 = hdr_min(raw_histogram);
            if (iVar4 == 1000) {
              iVar4 = hdr_min(cor_histogram);
              pcVar7 = (char *)0x0;
              if (iVar4 != 1000) {
                pcVar7 = "hdr_min(cor_histogram) != 1000";
              }
            }
            else {
              pcVar7 = "hdr_min(raw_histogram) != 1000";
            }
            tests_run = tests_run + 1;
            if (pcVar7 == (char *)0x0) {
              load_histograms();
              iVar4 = hdr_max(raw_histogram);
              _Var1 = hdr_values_are_equivalent(raw_histogram,iVar4,100000000);
              if (_Var1) {
                iVar4 = hdr_max(cor_histogram);
                _Var1 = hdr_values_are_equivalent(cor_histogram,iVar4,100000000);
                pcVar7 = (char *)0x0;
                if (!_Var1) {
                  pcVar7 = "hdr_max(cor_histogram) != 100000000L";
                }
              }
              else {
                pcVar7 = "hdr_max(raw_histogram) != 100000000L";
              }
              tests_run = tests_run + 1;
              if (pcVar7 == (char *)0x0) {
                load_histograms();
                iVar4 = hdr_value_at_percentile(raw_histogram,30.0);
                _Var1 = compare_percentile(iVar4,1000.0,in_XMM1_Qa);
                pcVar7 = "Value at 30% not 1000.0";
                if (_Var1) {
                  iVar4 = hdr_value_at_percentile(raw_histogram,99.0);
                  _Var1 = compare_percentile(iVar4,1000.0,in_XMM1_Qa);
                  if (_Var1) {
                    iVar4 = hdr_value_at_percentile(raw_histogram,99.99);
                    _Var1 = compare_percentile(iVar4,1000.0,in_XMM1_Qa);
                    if (_Var1) {
                      iVar4 = hdr_value_at_percentile(raw_histogram,99.999);
                      _Var1 = compare_percentile(iVar4,100000000.0,in_XMM1_Qa);
                      if (_Var1) {
                        iVar4 = hdr_value_at_percentile(raw_histogram,100.0);
                        _Var1 = compare_percentile(iVar4,100000000.0,in_XMM1_Qa);
                        if (_Var1) {
                          iVar4 = hdr_value_at_percentile(cor_histogram,30.0);
                          _Var1 = compare_percentile(iVar4,1000.0,in_XMM1_Qa);
                          if (_Var1) {
                            iVar4 = hdr_value_at_percentile(cor_histogram,50.0);
                            _Var1 = compare_percentile(iVar4,1000.0,in_XMM1_Qa);
                            if (_Var1) {
                              iVar4 = hdr_value_at_percentile(cor_histogram,75.0);
                              _Var1 = compare_percentile(iVar4,50000000.0,in_XMM1_Qa);
                              if (_Var1) {
                                iVar4 = hdr_value_at_percentile(cor_histogram,90.0);
                                _Var1 = compare_percentile(iVar4,80000000.0,in_XMM1_Qa);
                                if (_Var1) {
                                  iVar4 = hdr_value_at_percentile(cor_histogram,99.0);
                                  _Var1 = compare_percentile(iVar4,98000000.0,in_XMM1_Qa);
                                  if (_Var1) {
                                    iVar4 = hdr_value_at_percentile(cor_histogram,99.999);
                                    _Var1 = compare_percentile(iVar4,100000000.0,in_XMM1_Qa);
                                    pcVar7 = "Value at 99.999% not 100000000.0";
                                    if (_Var1) {
                                      iVar4 = hdr_value_at_percentile(cor_histogram,100.0);
                                      _Var1 = compare_percentile(iVar4,100000000.0,in_XMM1_Qa);
                                      pcVar7 = (char *)0x0;
                                      if (!_Var1) {
                                        pcVar7 = "Value at 100% not 100000000.0";
                                      }
                                    }
                                  }
                                  else {
                                    pcVar7 = "Value at 99% not 98000000.0";
                                  }
                                }
                                else {
                                  pcVar7 = "Value at 90% not 80000000.0";
                                }
                              }
                              else {
                                pcVar7 = "Value at 75% not 50000000.0";
                              }
                            }
                            else {
                              pcVar7 = "Value at 50% not 1000.0";
                            }
                          }
                        }
                        else {
                          pcVar7 = "Value at 100% not 100000000.0";
                        }
                      }
                      else {
                        pcVar7 = "Value at 99.999% not 100000000.0";
                      }
                    }
                    else {
                      pcVar7 = "Value at 99.99% not 1000.0";
                    }
                  }
                  else {
                    pcVar7 = "Value at 99% not 1000.0";
                  }
                }
                tests_run = tests_run + 1;
                if (pcVar7 == (char *)0x0) {
                  load_histograms();
                  hdr_iter_recorded_init((hdr_iter *)&h,raw_histogram);
                  while (_Var1 = hdr_iter_next((hdr_iter *)&h), _Var1) {
                    if (iVar2 == 2) {
                      if (local_90.linear.value_units_per_bucket != 10000) {
                        pcVar7 = "Value at 0 is not 10000";
                        goto LAB_0010191d;
                      }
                    }
                    else {
                      pcVar7 = "Value at 1 is not 1";
                      if (local_90.linear.value_units_per_bucket != 1) goto LAB_0010191d;
                    }
                    iVar2 = iVar2 + -1;
                  }
                  if (iVar2 == 0) {
                    hdr_iter_recorded_init((hdr_iter *)&h,cor_histogram);
                    iVar2 = 0;
                    lVar8 = 0;
                    while (_Var1 = hdr_iter_next((hdr_iter *)&h), _Var1) {
                      bVar10 = iVar2 == 0;
                      iVar2 = iVar2 + -1;
                      pcVar7 = "Count at 0 is not 10000";
                      if (local_90.linear.value_units_per_bucket != 10000 && bVar10)
                      goto LAB_0010191d;
                      if (local_d0 == 0) {
                        pcVar7 = "Count should not be 0";
                        goto LAB_0010191d;
                      }
                      pcVar7 = "Count at value iterated to should be count added in this step";
                      if (local_d0 != local_90.linear.value_units_per_bucket) goto LAB_0010191d;
                      lVar8 = lVar8 + local_90.linear.value_units_per_bucket;
                    }
                    pcVar7 = (char *)0x0;
                    if (lVar8 != 20000) {
                      pcVar7 = "Total counts should be 20000";
                    }
                  }
                  else {
                    pcVar7 = "Should have encountered 2 values";
                  }
LAB_0010191d:
                  tests_run = tests_run + 1;
                  if (pcVar7 == (char *)0x0) {
                    load_histograms();
                    hdr_iter_linear_init((hdr_iter *)&h,raw_histogram,100000);
                    lVar8 = 0;
                    pcVar7 = "Count at 999 is not 1";
                    while (_Var1 = hdr_iter_next((hdr_iter *)&h), _Var1) {
                      if ((int)lVar8 == 999) {
                        if ((double)local_90.linear.count_added_in_this_iteration_step !=
                            4.94065645841247e-324) goto LAB_00101aff;
                      }
                      else if ((int)lVar8 == 0) {
                        if ((double)local_90.linear.count_added_in_this_iteration_step !=
                            4.94065645841247e-320) {
                          pcVar7 = "Count at 0 is not 10000";
                          goto LAB_00101aff;
                        }
                      }
                      else if ((double)local_90.linear.count_added_in_this_iteration_step != 0.0) {
                        pcVar7 = "Count should be 0";
                        goto LAB_00101aff;
                      }
                      lVar8 = lVar8 + 1;
                    }
                    _Var1 = compare_int64(lVar8,1000);
                    if (_Var1) {
                      hdr_iter_linear_init((hdr_iter *)&h,cor_histogram,10000);
                      iVar2 = 10000;
                      lVar8 = 0;
                      pcVar7 = "Count at 0 is not 10001";
                      do {
                        _Var1 = hdr_iter_next((hdr_iter *)&h);
                        if (!_Var1) {
                          if (iVar2 == 0) {
                            pcVar7 = (char *)0x0;
                            if (lVar8 != 20000) {
                              pcVar7 = "Should of met 20000 counts";
                            }
                          }
                          else {
                            pcVar7 = "Should of met 10001 values";
                          }
                          break;
                        }
                        bVar10 = iVar2 != 10000;
                        lVar8 = lVar8 + local_90.linear.count_added_in_this_iteration_step;
                        iVar2 = iVar2 + -1;
                      } while ((double)local_90.linear.count_added_in_this_iteration_step ==
                               4.94115052405831e-320 || bVar10);
                    }
                    else {
                      pcVar7 = "Should of met 1000 values";
                    }
LAB_00101aff:
                    tests_run = tests_run + 1;
                    if (pcVar7 == (char *)0x0) {
                      load_histograms();
                      hdr_iter_log_init((hdr_iter *)&h,raw_histogram,10000,2.0);
                      iVar2 = 0;
                      while (_Var1 = hdr_iter_next((hdr_iter *)&h), _Var1) {
                        if (iVar2 == 0xe) {
                          pcVar7 = "Raw Logarithmic 10 msec bucket # 14 added a count of 1";
                          if ((double)local_90.linear.count_added_in_this_iteration_step !=
                              4.94065645841247e-324) goto LAB_00101c12;
                        }
                        else if (iVar2 == 0) {
                          if ((double)local_90.linear.count_added_in_this_iteration_step !=
                              4.94065645841247e-320) {
                            pcVar7 = "Raw Logarithmic 10 msec bucket # 0 added a count of 10000";
                            goto LAB_00101c12;
                          }
                        }
                        else {
                          pcVar7 = "Raw Logarithmic 10 msec bucket added a count of 0";
                          if ((double)local_90.linear.count_added_in_this_iteration_step != 0.0)
                          goto LAB_00101c12;
                        }
                        iVar2 = iVar2 + 1;
                      }
                      pcVar7 = "Should of seen 14 values";
                      if (iVar2 == 0xf) {
                        hdr_iter_log_init((hdr_iter *)&h,cor_histogram,10000,2.0);
                        iVar2 = 0xf;
                        lVar8 = 0;
                        pcVar7 = "Corrected Logarithmic 10 msec bucket # 0 added a count of 10001";
                        do {
                          _Var1 = hdr_iter_next((hdr_iter *)&h);
                          if (!_Var1) {
                            pcVar7 = "Should of seen 14 values";
                            if ((iVar2 == 0) && (pcVar7 = (char *)0x0, lVar8 != 20000)) {
                              pcVar7 = "Should of seen count of 20000";
                            }
                            break;
                          }
                          bVar10 = iVar2 != 0xf;
                          lVar8 = lVar8 + local_90.linear.count_added_in_this_iteration_step;
                          iVar2 = iVar2 + -1;
                        } while ((double)local_90.linear.count_added_in_this_iteration_step ==
                                 4.94115052405831e-320 || bVar10);
                      }
LAB_00101c12:
                      tests_run = tests_run + 1;
                      if (pcVar7 == (char *)0x0) {
                        load_histograms();
                        iVar4 = hdr_value_at_percentile(raw_histogram,99.0);
                        pcVar7 = "Value at 99% == 0.0";
                        if ((iVar4 != 0) &&
                           (iVar4 = hdr_value_at_percentile(cor_histogram,99.0), iVar4 != 0)) {
                          hdr_reset(raw_histogram);
                          hdr_reset(cor_histogram);
                          if (raw_histogram->total_count == 0) {
                            if (cor_histogram->total_count == 0) {
                              iVar4 = hdr_value_at_percentile(raw_histogram,99.0);
                              if (iVar4 == 0) {
                                iVar4 = hdr_value_at_percentile(cor_histogram,99.0);
                                pcVar7 = "Value at 99% not 0.0";
                                if (iVar4 == 0) {
                                  pcVar7 = (char *)0x0;
                                }
                              }
                              else {
                                pcVar7 = "Value at 99% not 0.0";
                              }
                            }
                            else {
                              pcVar7 = "Total corrected count != 0";
                            }
                          }
                          else {
                            pcVar7 = "Total raw count != 0";
                          }
                        }
                        tests_run = tests_run + 1;
                        if (pcVar7 == (char *)0x0) {
                          load_histograms();
                          local_68 = hdr_mean(cor_histogram);
                          local_68 = local_68 * 512.0;
                          b_00 = hdr_mean(scaled_cor_histogram);
                          _Var1 = compare_values(local_68,b_00,1e-06);
                          if (_Var1) {
                            _Var1 = compare_int64(cor_histogram->total_count,
                                                  scaled_cor_histogram->total_count);
                            if (_Var1) {
                              iVar4 = hdr_value_at_percentile(cor_histogram,99.0);
                              iVar5 = hdr_value_at_percentile(scaled_cor_histogram,99.0);
                              iVar4 = hdr_lowest_equivalent_value(cor_histogram,iVar4 << 9);
                              iVar5 = hdr_lowest_equivalent_value(scaled_cor_histogram,iVar5);
                              _Var1 = compare_int64(iVar4,iVar5);
                              pcVar7 = (char *)0x0;
                              if (!_Var1) {
                                pcVar7 = "99%\'iles should be equivalent";
                              }
                            }
                            else {
                              pcVar7 = "Total count should be equivalent";
                            }
                          }
                          else {
                            pcVar7 = "Averages should be equivalent";
                          }
                          tests_run = tests_run + 1;
                          if (pcVar7 == (char *)0x0) {
                            hdr_init(1,1000,4,&h);
                            _Var1 = hdr_record_value_atomic(h,1000);
                            if (_Var1) {
                              _Var1 = hdr_record_value_atomic(h,0x3e9);
                              pcVar7 = (char *)0x0;
                              if (_Var1) {
                                pcVar7 = "Should not record value";
                              }
                            }
                            else {
                              pcVar7 = "Should successfully record value";
                            }
                            tests_run = tests_run + 1;
                            if (pcVar7 == (char *)0x0) {
                              hdr_init(1,0xff,2,&h_1);
                              hdr_record_value_atomic(h_1,0xc1);
                              hdr_record_value_atomic(h_1,0xff);
                              lVar8 = 0;
                              hdr_record_value_atomic(h_1,0);
                              hdr_record_value_atomic(h_1,1);
                              hdr_record_value_atomic(h_1,0x40);
                              hdr_record_value_atomic(h_1,0x80);
                              hdr_iter_linear_init((hdr_iter *)&h,h_1,0x40);
                              b = 0;
                              while (_Var1 = hdr_iter_next((hdr_iter *)&h), _Var1) {
                                b = b + local_90.linear.count_added_in_this_iteration_step;
                                if ((int)lVar8 == 0) {
                                  hdr_record_value_atomic(h_1,2);
                                }
                                lVar8 = lVar8 + 1;
                              }
                              _Var1 = compare_int64(4,lVar8);
                              if (_Var1) {
                                _Var1 = compare_int64(6,b);
                                pcVar7 = (char *)0x0;
                                if (!_Var1) {
                                  pcVar7 = "Total count";
                                }
                              }
                              else {
                                pcVar7 = "Number of steps";
                              }
                              tests_run = tests_run + 1;
                              if (pcVar7 == (char *)0x0) {
                                hdr_interval_recorder_init_all
                                          ((hdr_interval_recorder *)&h,1,86400000000,3);
                                hdr_interval_recorder_init_all
                                          ((hdr_interval_recorder *)&h_1,1,86400000000,3);
                                hdr_init(1,86400000000,3,&expected_histogram);
                                hdr_init(1,86400000000,3,&expected_corrected_histogram);
                                iVar2 = 1000000;
                                while (bVar10 = iVar2 != 0, iVar2 = iVar2 + -1, bVar10) {
                                  iVar3 = rand();
                                  lVar8 = (long)(iVar3 % 20000);
                                  hdr_record_value(expected_histogram,lVar8);
                                  hdr_record_corrected_value
                                            (expected_corrected_histogram,lVar8,1000);
                                  hdr_interval_recorder_record_value_atomic
                                            ((hdr_interval_recorder *)&h,lVar8);
                                  hdr_interval_recorder_record_corrected_value_atomic
                                            ((hdr_interval_recorder *)&h_1,lVar8,1000);
                                }
                                phVar6 = hdr_interval_recorder_sample((hdr_interval_recorder *)&h);
                                pcVar7 = compare_histograms(expected_histogram,phVar6);
                                if (pcVar7 == (char *)0x0) {
                                  phVar6 = hdr_interval_recorder_sample
                                                     ((hdr_interval_recorder *)&h_1);
                                  pcVar7 = compare_histograms(expected_corrected_histogram,phVar6);
                                }
                                tests_run = tests_run + 1;
                                if (pcVar7 == (char *)0x0) {
                                  puts("ALL TESTS PASSED");
                                  iVar2 = 0;
                                  goto LAB_001012c2;
                                }
                                pcVar9 = "test_interval_recording";
                              }
                              else {
                                pcVar9 = "test_linear_iter_buckets_correctly";
                              }
                            }
                            else {
                              pcVar9 = "test_out_of_range_values";
                            }
                          }
                          else {
                            pcVar9 = "test_scaling_equivalence";
                          }
                        }
                        else {
                          pcVar9 = "test_reset";
                        }
                      }
                      else {
                        pcVar9 = "test_logarithmic_values";
                      }
                    }
                    else {
                      pcVar9 = "test_linear_values";
                    }
                  }
                  else {
                    pcVar9 = "test_recorded_values";
                  }
                }
                else {
                  pcVar9 = "test_percentiles";
                }
              }
              else {
                pcVar9 = "test_get_max_value";
              }
            }
            else {
              pcVar9 = "test_get_min_value";
            }
          }
          else {
            pcVar9 = "test_total_count";
          }
        }
        else {
          pcVar9 = "test_invalid_significant_figures";
        }
      }
      else {
        pcVar9 = "test_create_with_large_values";
      }
    }
    else {
      pcVar9 = "test_invalid_init";
    }
  }
  else {
LAB_001012a1:
    tests_run = tests_run + 1;
    pcVar9 = "test_create";
  }
  printf("hdr_histogram_test.%s(): %s\n",pcVar9,pcVar7);
  iVar2 = -1;
LAB_001012c2:
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return iVar2;
}

Assistant:

int main(void)
{
    return hdr_histogram_run_tests();
}